

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t FSE_decompress_wksp_bmi2
                 (void *dst,size_t dstCapacity,void *cSrc,size_t cSrcSize,uint maxLog,
                 void *workSpace,size_t wkspSize,int bmi2)

{
  uchar *puVar1;
  uchar *puVar2;
  long lVar3;
  FSE_DTable *pFVar4;
  uchar uVar5;
  size_t sVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  FSE_DState_t *pFVar11;
  bool bVar12;
  size_t sStack_a0;
  BIT_DStream_t bitD;
  uint local_60;
  uint tableLog;
  FSE_DTable *local_58;
  FSE_DState_t state1;
  FSE_DState_t local_40;
  
  if (bmi2 != 0) {
    sVar6 = FSE_decompress_wksp_body_bmi2(dst,dstCapacity,cSrc,cSrcSize,maxLog,workSpace,wkspSize);
    return sVar6;
  }
  local_60 = 0xff;
  if (wkspSize < 0x204) {
    sStack_a0 = 0xffffffffffffffff;
  }
  else {
    sVar6 = FSE_readNCount_bmi2((short *)workSpace,&local_60,&tableLog,cSrc,cSrcSize,0);
    sStack_a0 = sVar6;
    if (((sVar6 < 0xffffffffffffff89) && (sStack_a0 = 0xffffffffffffffd4, tableLog <= maxLog)) &&
       (lVar8 = (long)(1 << ((byte)tableLog & 0x1f)),
       ((1L << ((byte)tableLog & 0x3f)) + lVar8 * 4 + (ulong)(local_60 + 1) * 2 + 0x13 &
       0xfffffffffffffffc) + 0x204 <= wkspSize)) {
      local_58 = (FSE_DTable *)((long)workSpace + 0x200);
      sStack_a0 = FSE_buildDTable_internal
                            (local_58,(short *)workSpace,local_60,tableLog,
                             (void *)(lVar8 * 4 + 0x208 + (long)workSpace),
                             (wkspSize - (lVar8 * 4 + 4)) - 0x204);
      if (sStack_a0 < 0xffffffffffffff89) {
        puVar2 = (uchar *)((long)dst + (dstCapacity - 3));
        if (*(short *)((long)workSpace + 0x202) == 0) {
          sStack_a0 = BIT_initDStream(&bitD,(void *)((long)cSrc + sVar6),cSrcSize - sVar6);
          pFVar4 = local_58;
          if (sStack_a0 < 0xffffffffffffff89) {
            FSE_initDState(&state1,&bitD,local_58);
            FSE_initDState(&local_40,&bitD,pFVar4);
            lVar8 = 0;
            while (bitD.bitsConsumed < 0x41) {
              if (bitD.ptr < bitD.limitPtr) {
                if (bitD.ptr == bitD.start) break;
                bVar12 = bitD.start <= bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3);
                uVar7 = (int)bitD.ptr - (int)bitD.start;
                if (bVar12) {
                  uVar7 = bitD.bitsConsumed >> 3;
                }
                bitD.bitsConsumed = bitD.bitsConsumed + uVar7 * -8;
              }
              else {
                uVar7 = bitD.bitsConsumed >> 3;
                bitD.bitsConsumed = bitD.bitsConsumed & 7;
                bVar12 = true;
              }
              bitD.ptr = bitD.ptr + -(ulong)uVar7;
              puVar1 = (uchar *)((long)dst + lVar8);
              bitD.bitContainer = *(size_t *)bitD.ptr;
              if ((puVar2 <= puVar1) || (!bVar12)) break;
              uVar5 = FSE_decodeSymbol(&state1,&bitD);
              *puVar1 = uVar5;
              uVar5 = FSE_decodeSymbol(&local_40,&bitD);
              puVar1[1] = uVar5;
              uVar5 = FSE_decodeSymbol(&state1,&bitD);
              puVar1[2] = uVar5;
              uVar5 = FSE_decodeSymbol(&local_40,&bitD);
              puVar1[3] = uVar5;
              lVar8 = lVar8 + 4;
            }
            puVar2 = (uchar *)((long)dst + (dstCapacity - 2));
            pFVar11 = &local_40;
            for (; sStack_a0 = 0xffffffffffffffba, (uchar *)((long)dst + lVar8) <= puVar2;
                lVar8 = lVar8 + 2) {
              uVar5 = FSE_decodeSymbol(&state1,&bitD);
              *(uchar *)((long)dst + lVar8) = uVar5;
              if (0x40 < bitD.bitsConsumed) {
                lVar3 = lVar8 + 1;
                lVar10 = 2;
LAB_0013a4c9:
                uVar5 = FSE_decodeSymbol(pFVar11,&bitD);
                goto LAB_0013a4d4;
              }
              if (bitD.ptr < bitD.limitPtr) {
                if (bitD.ptr != bitD.start) {
                  uVar7 = (int)bitD.ptr - (int)bitD.start;
                  if (bitD.start <= bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3)) {
                    uVar7 = bitD.bitsConsumed >> 3;
                  }
                  bitD.bitsConsumed = bitD.bitsConsumed + uVar7 * -8;
                  goto LAB_0013a3b0;
                }
              }
              else {
                uVar7 = bitD.bitsConsumed >> 3;
                bitD.bitsConsumed = bitD.bitsConsumed & 7;
LAB_0013a3b0:
                bitD.ptr = bitD.ptr + -(ulong)uVar7;
                bitD.bitContainer = *(size_t *)bitD.ptr;
              }
              puVar1 = (uchar *)((long)dst + lVar8 + 1);
              if (puVar2 < puVar1) {
                return 0xffffffffffffffba;
              }
              uVar5 = FSE_decodeSymbol(pFVar11,&bitD);
              *puVar1 = uVar5;
              if (0x40 < bitD.bitsConsumed) {
                lVar3 = lVar8 + 2;
                lVar10 = 3;
                pFVar11 = &state1;
                goto LAB_0013a4c9;
              }
              if (bitD.ptr < bitD.limitPtr) {
                if (bitD.ptr != bitD.start) {
                  uVar9 = (ulong)(uint)((int)bitD.ptr - (int)bitD.start);
                  if (bitD.start <= bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3)) {
                    uVar9 = (ulong)(bitD.bitsConsumed >> 3);
                  }
                  bitD.ptr = bitD.ptr + -uVar9;
                  bitD.bitsConsumed = bitD.bitsConsumed + (int)uVar9 * -8;
                  bitD.bitContainer = *(size_t *)bitD.ptr;
                }
              }
              else {
                bitD.ptr = bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3);
                bitD.bitsConsumed = bitD.bitsConsumed & 7;
                bitD.bitContainer = *(size_t *)bitD.ptr;
              }
            }
          }
        }
        else {
          sStack_a0 = BIT_initDStream(&bitD,(void *)((long)cSrc + sVar6),cSrcSize - sVar6);
          pFVar4 = local_58;
          if (sStack_a0 < 0xffffffffffffff89) {
            FSE_initDState(&state1,&bitD,local_58);
            FSE_initDState(&local_40,&bitD,pFVar4);
            lVar8 = 0;
            while (bitD.bitsConsumed < 0x41) {
              if (bitD.ptr < bitD.limitPtr) {
                if (bitD.ptr == bitD.start) break;
                bVar12 = bitD.start <= bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3);
                uVar7 = (int)bitD.ptr - (int)bitD.start;
                if (bVar12) {
                  uVar7 = bitD.bitsConsumed >> 3;
                }
                bitD.bitsConsumed = bitD.bitsConsumed + uVar7 * -8;
              }
              else {
                uVar7 = bitD.bitsConsumed >> 3;
                bitD.bitsConsumed = bitD.bitsConsumed & 7;
                bVar12 = true;
              }
              bitD.ptr = bitD.ptr + -(ulong)uVar7;
              puVar1 = (uchar *)((long)dst + lVar8);
              bitD.bitContainer = *(size_t *)bitD.ptr;
              if ((puVar2 <= puVar1) || (!bVar12)) break;
              uVar5 = FSE_decodeSymbolFast(&state1,&bitD);
              *puVar1 = uVar5;
              uVar5 = FSE_decodeSymbolFast(&local_40,&bitD);
              puVar1[1] = uVar5;
              uVar5 = FSE_decodeSymbolFast(&state1,&bitD);
              puVar1[2] = uVar5;
              uVar5 = FSE_decodeSymbolFast(&local_40,&bitD);
              puVar1[3] = uVar5;
              lVar8 = lVar8 + 4;
            }
            puVar2 = (uchar *)((long)dst + (dstCapacity - 2));
            sStack_a0 = 0xffffffffffffffba;
            pFVar11 = &local_40;
            for (; (uchar *)((long)dst + lVar8) <= puVar2; lVar8 = lVar8 + 2) {
              uVar5 = FSE_decodeSymbolFast(&state1,&bitD);
              *(uchar *)((long)dst + lVar8) = uVar5;
              if (0x40 < bitD.bitsConsumed) {
                lVar3 = lVar8 + 1;
                lVar10 = 2;
                goto LAB_0013a494;
              }
              if (bitD.ptr < bitD.limitPtr) {
                if (bitD.ptr != bitD.start) {
                  uVar7 = (int)bitD.ptr - (int)bitD.start;
                  if (bitD.start <= bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3)) {
                    uVar7 = bitD.bitsConsumed >> 3;
                  }
                  bitD.bitsConsumed = bitD.bitsConsumed + uVar7 * -8;
                  goto LAB_0013a266;
                }
              }
              else {
                uVar7 = bitD.bitsConsumed >> 3;
                bitD.bitsConsumed = bitD.bitsConsumed & 7;
LAB_0013a266:
                bitD.ptr = bitD.ptr + -(ulong)uVar7;
                bitD.bitContainer = *(size_t *)bitD.ptr;
              }
              puVar1 = (uchar *)((long)dst + lVar8 + 1);
              if (puVar2 < puVar1) {
                return 0xffffffffffffffba;
              }
              uVar5 = FSE_decodeSymbolFast(pFVar11,&bitD);
              *puVar1 = uVar5;
              if (0x40 < bitD.bitsConsumed) {
                lVar3 = lVar8 + 2;
                lVar10 = 3;
                pFVar11 = &state1;
LAB_0013a494:
                uVar5 = FSE_decodeSymbolFast(pFVar11,&bitD);
LAB_0013a4d4:
                *(uchar *)((long)dst + lVar3) = uVar5;
                return lVar10 + lVar8;
              }
              if (bitD.ptr < bitD.limitPtr) {
                if (bitD.ptr != bitD.start) {
                  uVar9 = (ulong)(uint)((int)bitD.ptr - (int)bitD.start);
                  if (bitD.start <= bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3)) {
                    uVar9 = (ulong)(bitD.bitsConsumed >> 3);
                  }
                  bitD.ptr = bitD.ptr + -uVar9;
                  bitD.bitsConsumed = bitD.bitsConsumed + (int)uVar9 * -8;
                  bitD.bitContainer = *(size_t *)bitD.ptr;
                }
              }
              else {
                bitD.ptr = bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3);
                bitD.bitsConsumed = bitD.bitsConsumed & 7;
                bitD.bitContainer = *(size_t *)bitD.ptr;
              }
            }
          }
        }
      }
    }
  }
  return sStack_a0;
}

Assistant:

size_t FSE_decompress_wksp_bmi2(void* dst, size_t dstCapacity, const void* cSrc, size_t cSrcSize, unsigned maxLog, void* workSpace, size_t wkspSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        return FSE_decompress_wksp_body_bmi2(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize);
    }
#endif
    (void)bmi2;
    return FSE_decompress_wksp_body_default(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize);
}